

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> __thiscall
llvm::WritableMemoryBuffer::getNewUninitMemBuffer
          (WritableMemoryBuffer *this,size_t Size,Twine *BufferName)

{
  uint64_t uVar1;
  pointer __p;
  long lVar2;
  StringRef Data;
  StringRef local_1b0;
  MemBuffer *Ret;
  char *Buf;
  char *Mem;
  size_t RealLen;
  size_t AlignedStringLen;
  StringRef NameRef;
  SmallString<256U> NameBuf;
  Twine *BufferName_local;
  size_t Size_local;
  
  SmallString<256U>::SmallString((SmallString<256U> *)&NameRef.Length);
  Data = Twine::toStringRef(BufferName,(SmallVectorImpl<char> *)&NameRef.Length);
  NameRef.Data = (char *)Data.Length;
  uVar1 = alignTo((uint64_t)(NameRef.Data + 0x19),0x10,0);
  __p = (pointer)operator_new(uVar1 + Size + 1,(nothrow_t *)&std::nothrow);
  if (__p == (pointer)0x0) {
    std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>::
    unique_ptr<std::default_delete<llvm::WritableMemoryBuffer>,void>
              ((unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>
                *)this,(nullptr_t)0x0);
  }
  else {
    CopyStringRef((char *)(__p + 1),Data);
    lVar2 = (long)&(__p->super_MemoryBuffer)._vptr_MemoryBuffer + uVar1;
    *(undefined1 *)(lVar2 + Size) = 0;
    local_1b0.Data = (char *)lVar2;
    local_1b0.Length = Size;
    anon_unknown.dwarf_bb0eb::MemoryBufferMem<llvm::WritableMemoryBuffer>::MemoryBufferMem
              ((MemoryBufferMem<llvm::WritableMemoryBuffer> *)__p,local_1b0,true);
    std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>::
    unique_ptr<std::default_delete<llvm::WritableMemoryBuffer>,void>
              ((unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>
                *)this,__p);
  }
  SmallString<256U>::~SmallString((SmallString<256U> *)&NameRef.Length);
  return (__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
          )(__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<WritableMemoryBuffer>
WritableMemoryBuffer::getNewUninitMemBuffer(size_t Size, const Twine &BufferName) {
  using MemBuffer = MemoryBufferMem<WritableMemoryBuffer>;
  // Allocate space for the MemoryBuffer, the data and the name. It is important
  // that MemoryBuffer and data are aligned so PointerIntPair works with them.
  // TODO: Is 16-byte alignment enough?  We copy small object files with large
  // alignment expectations into this buffer.
  SmallString<256> NameBuf;
  StringRef NameRef = BufferName.toStringRef(NameBuf);
  size_t AlignedStringLen = alignTo(sizeof(MemBuffer) + NameRef.size() + 1, 16);
  size_t RealLen = AlignedStringLen + Size + 1;
  char *Mem = static_cast<char*>(operator new(RealLen, std::nothrow));
  if (!Mem)
    return nullptr;

  // The name is stored after the class itself.
  CopyStringRef(Mem + sizeof(MemBuffer), NameRef);

  // The buffer begins after the name and must be aligned.
  char *Buf = Mem + AlignedStringLen;
  Buf[Size] = 0; // Null terminate buffer.

  auto *Ret = new (Mem) MemBuffer(StringRef(Buf, Size), true);
  return std::unique_ptr<WritableMemoryBuffer>(Ret);
}